

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

HFSubConsumer * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          size_t messageBufferLength)

{
  bool bVar1;
  HFSubConsumer *pHVar2;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  std::__cxx11::string::string((string *)&local_e0,(string *)dataName);
  std::__cxx11::string::string((string *)&local_100,(string *)originModule);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_120,(string *)dataName);
    std::__cxx11::string::string((string *)&local_140,(string *)originModule);
    pHVar2 = (HFSubConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    if ((pHVar2->super_HighFreqSub).sockType == ST_CONSUMER) {
      return pHVar2;
    }
  }
  bVar1 = network_pimpl::hfdt_exists((this->super_MlmWrap).state,dataName,originModule);
  if (bVar1) {
    network_pimpl::find_hfdt(&local_c0,(this->super_MlmWrap).state,dataName,originModule);
    pHVar2 = MlmWrap::createConsumerSub(&this->super_MlmWrap,&local_c0,messageBufferLength);
    HighFreqDataType::~HighFreqDataType(&local_c0);
  }
  else {
    pHVar2 = (HFSubConsumer *)0x0;
  }
  return pHVar2;
}

Assistant:

HFSubConsumer* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, size_t messageBufferLength) {
//    std::cout << "mlmWRAP: Attempting to make a Consumer Sub to [" << dataName << "] from [" << originModule << "]\n";

    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_CONSUMER)
            return (HFSubConsumer*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createConsumerSub( state->find_hfdt(dataName, originModule), messageBufferLength ) );
    }
    else {
        // std::cerr << error("The specified type does not exist.\n");
        return(NULL);
    }
}